

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O2

void SimpleBVH::point_triangle_squared_distance
               (VectorMax3d *x,array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_3UL> *f,VectorMax3d *pt,
               double *dist)

{
  MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *this;
  Index *pIVar1;
  MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *this_00;
  MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *src;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,3,1>> *this_01;
  ReturnType RVar2;
  ReturnType RVar3;
  ReturnType RVar4;
  ReturnType RVar5;
  ReturnType RVar6;
  ReturnType RVar7;
  RealScalar RVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,3,1>> local_238 [8];
  VectorMax3d ax;
  VectorMax3d bx;
  VectorMax3d cx;
  double w_2;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
  local_1b0;
  LhsNested local_170;
  double v_1;
  double local_148;
  double v;
  double w;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,3,1>> local_c8 [8];
  VectorMax3d ac;
  VectorMax3d ab;
  
  this_00 = (MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)(f->_M_elems + 1);
  this = (MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)(f->_M_elems + 2);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
              *)&w,this_00,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)f);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,3,1>> *)
             &ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
              *)&w);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
              *)&w,this,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)f);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
            (local_c8,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                       *)&w);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
              *)&w,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)x,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)f);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
            (local_238,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
              *)&w);
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::dot<Eigen::Matrix<double,_1,1,0,3,1>>
                    ((MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)
                     &ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                      m_rows,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)local_238);
  RVar3 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::dot<Eigen::Matrix<double,_1,1,0,3,1>>
                    ((MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)local_c8,
                     (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)local_238);
  if ((0.0 < RVar2) || (0.0 < RVar3)) {
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                *)&w,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)x,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)this_00);
    pIVar1 = &ax.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,3,1>> *)pIVar1,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                *)&w);
    RVar4 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::
            dot<Eigen::Matrix<double,_1,1,0,3,1>>
                      ((MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)
                       &ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                        m_rows,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)pIVar1);
    RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::
            dot<Eigen::Matrix<double,_1,1,0,3,1>>
                      ((MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)local_c8,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)pIVar1);
    if ((RVar4 < 0.0) || (src = this_00, RVar4 < RVar5)) {
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                  *)&w,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)x,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)this);
      pIVar1 = &bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,3,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,3,1>> *)pIVar1,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                  *)&w);
      RVar6 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::
              dot<Eigen::Matrix<double,_1,1,0,3,1>>
                        ((MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)
                         &ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage
                          .m_rows,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)pIVar1);
      RVar7 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::
              dot<Eigen::Matrix<double,_1,1,0,3,1>>
                        ((MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)local_c8,
                         (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)pIVar1);
      if ((RVar7 < 0.0) || (src = this, RVar7 < RVar6)) {
        dVar9 = RVar2 * RVar5 - RVar3 * RVar4;
        if ((-RVar4 < RVar4) || ((RVar2 < 0.0 || (0.0 < dVar9)))) {
          dVar10 = RVar6 * RVar3 - RVar2 * RVar7;
          if (((0.0 < RVar7) || (RVar3 < 0.0)) || (0.0 < dVar10)) {
            dVar11 = RVar4 * RVar7 - RVar5 * RVar6;
            if (((0.0 < dVar11) || (dVar12 = RVar5 - RVar4, dVar12 < 0.0)) || (RVar6 - RVar7 < 0.0))
            {
              dVar11 = 1.0 / (dVar11 + dVar10 + dVar9);
              local_148 = dVar10 * dVar11;
              v = dVar11 * dVar9;
              Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator*
                        ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                          *)&stack0xfffffffffffffe90,
                         (MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)
                         &ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage
                          .m_rows,&local_148);
              Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator+
                        ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                          *)&local_1b0,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)f,
                         (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                          *)&stack0xfffffffffffffe90);
              pIVar1 = &cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                        m_rows;
              Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator*
                        ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                          *)pIVar1,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)local_c8,&v);
              Eigen::
              MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,3,1>const>const>const>>
              ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                           *)&w,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,3,1>const>const>const>>
                                 *)&local_1b0,
                          (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                           *)pIVar1);
              Eigen::internal::
              call_assignment<Eigen::Matrix<double,_1,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,3,1>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,3,1>const>const>const>>
                        (pt,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                             *)&w);
            }
            else {
              cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows =
                   (Index)(dVar12 / ((RVar6 - RVar7) + dVar12));
              Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
                        ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                          *)&stack0xfffffffffffffe90,this,
                         (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)this_00);
              Eigen::
              MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>>
              ::operator*(&local_1b0,
                          (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                           *)&stack0xfffffffffffffe90,
                          (double *)
                          &cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                           m_storage.m_rows);
              Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator+
                        ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                          *)&w,this_00,
                         (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                          *)&local_1b0);
              Eigen::internal::
              call_assignment<Eigen::Matrix<double,_1,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,3,1>const>const>const>>
                        (pt,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                             *)&w);
            }
            goto LAB_00115af0;
          }
          local_170 = (LhsNested)(RVar3 / (RVar3 - RVar7));
          this_01 = local_c8;
        }
        else {
          local_170 = (LhsNested)(RVar2 / (RVar2 - RVar4));
          this_01 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,3,1>> *)
                    &ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                     m_rows;
        }
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator*
                  ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                    *)&local_1b0,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)this_01,
                   (double *)&stack0xfffffffffffffe90);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator+
                  ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                    *)&w,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)f,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                    *)&local_1b0);
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,3,1>const>const>const>>
                  (pt,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                       *)&w);
        goto LAB_00115af0;
      }
    }
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,3,1>,Eigen::Matrix<double,_1,1,0,3,1>>
              (pt,(Matrix<double,__1,_1,_0,_3,_1> *)src);
  }
  else {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,3,1>,Eigen::Matrix<double,_1,1,0,3,1>>
              (pt,f->_M_elems);
  }
LAB_00115af0:
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
              *)&w,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)x,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)pt);
  RVar8 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>_>
          ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                         *)&w);
  *dist = RVar8;
  return;
}

Assistant:

void point_triangle_squared_distance(
    const VectorMax3d& x,
    const std::array<VectorMax3d, 3>& f,
    VectorMax3d& pt,
    double& dist)
{
    const VectorMax3d& pa = f[0];
    const VectorMax3d& pb = f[1];
    const VectorMax3d& pc = f[2];

    // source: real time collision detection
    // check if x in vertex region outside pa
    VectorMax3d ab = pb - pa;
    VectorMax3d ac = pc - pa;
    VectorMax3d ax = x - pa;
    const double d1 = ab.dot(ax);
    const double d2 = ac.dot(ax);
    if (d1 <= 0 && d2 <= 0) {
        // barycentric coordinates (1, 0, 0)
        pt = pa;
        dist = (x - pt).squaredNorm();
        return;
    }

    // check if x in vertex region outside pb
    VectorMax3d bx = x - pb;
    const double d3 = ab.dot(bx);
    const double d4 = ac.dot(bx);
    if (d3 >= 0.0f && d4 <= d3) {
        // barycentric coordinates (0, 1, 0)
        pt = pb;
        dist = (x - pt).squaredNorm();
        return;
    }

    // check if x in vertex region outside pc
    VectorMax3d cx = x - pc;
    const double d5 = ab.dot(cx);
    const double d6 = ac.dot(cx);
    if (d6 >= 0.0f && d5 <= d6) {
        // barycentric coordinates (0, 0, 1)
        pt = pc;
        dist = (x - pt).squaredNorm();
        return;
    }

    // check if x in edge region of ab, if so return projection of x onto ab
    const double vc = d1 * d4 - d3 * d2;
    if (vc <= 0.0f && d1 >= 0.0f && d3 <= 0.0f) {
        // barycentric coordinates (1 - v, v, 0)
        const double v = d1 / (d1 - d3);
        pt = pa + ab * v;
        dist = (x - pt).squaredNorm();
        return;
    }

    // check if x in edge region of ac, if so return projection of x onto ac
    const double vb = d5 * d2 - d1 * d6;
    if (vb <= 0.0f && d2 >= 0.0f && d6 <= 0.0f) {
        // barycentric coordinates (1 - w, 0, w)
        const double w = d2 / (d2 - d6);
        pt = pa + ac * w;
        dist = (x - pt).squaredNorm();
        return;
    }

    // check if x in edge region of bc, if so return projection of x onto bc
    const double va = d3 * d6 - d5 * d4;
    if (va <= 0.0f && (d4 - d3) >= 0.0f && (d5 - d6) >= 0.0f) {
        // barycentric coordinates (0, 1 - w, w)
        const double w = (d4 - d3) / ((d4 - d3) + (d5 - d6));
        pt = pb + (pc - pb) * w;
        dist = (x - pt).squaredNorm();
        return;
    }

    // x inside face region. Compute pt through its barycentric coordinates (u,
    // v, w)
    const double denom = 1 / (va + vb + vc);
    const double v = vb * denom;
    const double w = vc * denom;

    pt = pa + ab * v + ac * w; //= u*a + v*b + w*c, u = va*denom = 1.0f - v - w
    dist = (x - pt).squaredNorm();
}